

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O3

void __thiscall
checkqueue_tests::test_CheckQueueControl_Locks::test_method(test_CheckQueueControl_Locks *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  __uniq_ptr_data<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>,_true,_true>
  this_00;
  pointer ptVar4;
  ulong uVar5;
  thread *ptVar6;
  undefined8 uVar7;
  anon_class_24_3_8803dd74_for__M_head_impl *extraout_RDX;
  anon_class_24_3_8803dd74_for__M_head_impl *extraout_RDX_00;
  anon_class_24_3_8803dd74_for__M_head_impl *extraout_RDX_01;
  anon_class_24_3_8803dd74_for__M_head_impl *extraout_RDX_02;
  anon_class_24_3_8803dd74_for__M_head_impl *extraout_RDX_03;
  anon_class_24_3_8803dd74_for__M_head_impl *__args;
  anon_class_56_7_0ebc48f7_for__M_head_impl *__args_00;
  anon_class_56_7_0ebc48f7_for__M_head_impl *extraout_RDX_04;
  anon_class_56_7_0ebc48f7_for__M_head_impl *__args_01;
  thread *thread_1;
  condition_variable *this_01;
  ulong uVar8;
  pointer ptVar9;
  iterator in_R8;
  iterator pvVar10;
  iterator in_R9;
  iterator pvVar11;
  atomic<int> *unaff_R12;
  pointer ptVar12;
  ulong uVar13;
  uint uVar14;
  thread *thread;
  thread *ptVar15;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar16;
  char *local_1a0;
  char *local_198;
  atomic<int> *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  undefined1 local_160 [16];
  atomic<int> *local_150;
  condition_variable *local_148;
  atomic<int> *local_140;
  atomic<int> *local_138;
  bool *local_130;
  mutex m;
  bool done_ack;
  undefined3 uStack_f3;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  atomic<int> fails;
  atomic<int> nThreads;
  vector<std::thread,_std::allocator<std::thread>_> tg;
  __single_object queue;
  bool has_lock;
  vector<std::thread,_std::allocator<std::thread>_> tg_1;
  unique_lock<std::mutex> l;
  condition_variable cv;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.
  super___uniq_ptr_impl<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>._M_t.
  super__Tuple_impl<0UL,_CCheckQueue<FakeCheck>_*,_std::default_delete<CCheckQueue<FakeCheck>_>_>.
  super__Head_base<0UL,_CCheckQueue<FakeCheck>_*,_false>._M_head_impl =
       (__uniq_ptr_impl<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>)
       operator_new(0x100);
  CCheckQueue<FakeCheck>::CCheckQueue
            ((CCheckQueue<FakeCheck> *)
             this_00.
             super___uniq_ptr_impl<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_CCheckQueue<FakeCheck>_*,_std::default_delete<CCheckQueue<FakeCheck>_>_>
             .super__Head_base<0UL,_CCheckQueue<FakeCheck>_*,_false>._M_head_impl,0x80,3);
  tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  nThreads.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  fails.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  this_01 = (condition_variable *)0x0;
  __args = extraout_RDX;
  queue._M_t.
  super___uniq_ptr_impl<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>._M_t.
  super__Tuple_impl<0UL,_CCheckQueue<FakeCheck>_*,_std::default_delete<CCheckQueue<FakeCheck>_>_>.
  super__Head_base<0UL,_CCheckQueue<FakeCheck>_*,_false>._M_head_impl =
       (__uniq_ptr_data<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>,_true,_true>
        )(__uniq_ptr_data<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>,_true,_true>
          )this_00.
           super___uniq_ptr_impl<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_CCheckQueue<FakeCheck>_*,_std::default_delete<CCheckQueue<FakeCheck>_>_>
           .super__Head_base<0UL,_CCheckQueue<FakeCheck>_*,_false>._M_head_impl;
  do {
    ptVar9 = tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ptVar12 = tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_160._0_8_ = &queue;
    local_160._8_8_ = &nThreads;
    local_150 = &fails;
    if (tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      if ((long)tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0031698d;
        std::__throw_length_error("vector::_M_realloc_insert");
        goto LAB_003167ce;
      }
      uVar5 = (long)tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      uVar8 = uVar5 + (uVar5 == 0);
      unaff_R12 = (atomic<int> *)(uVar8 + uVar5);
      if ((atomic<int> *)0xffffffffffffffe < unaff_R12) {
        unaff_R12 = (atomic<int> *)0xfffffffffffffff;
      }
      if (CARRY8(uVar8,uVar5)) {
        unaff_R12 = (atomic<int> *)0xfffffffffffffff;
      }
      if (unaff_R12 == (atomic<int> *)0x0) {
        ptVar6 = (thread *)0x0;
      }
      else {
        ptVar6 = __gnu_cxx::new_allocator<std::thread>::allocate
                           ((new_allocator<std::thread> *)&tg,(size_type)unaff_R12,(void *)0x0);
        __args = extraout_RDX_01;
      }
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,checkqueue_tests::test_CheckQueueControl_Locks::test_method()::__0>
                ((allocator_type *)(ptVar6 + uVar5),(thread *)local_160,__args);
      ptVar15 = ptVar6;
      for (ptVar4 = ptVar12; ptVar4 != ptVar9; ptVar4 = ptVar4 + 1) {
        (ptVar15->_M_id)._M_thread = (ptVar4->_M_id)._M_thread;
        (ptVar4->_M_id)._M_thread = 0;
        ptVar15 = ptVar15 + 1;
      }
      __args = extraout_RDX_02;
      if (ptVar12 != (pointer)0x0) {
        operator_delete(ptVar12,(long)tg.
                                      super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ptVar12);
        __args = extraout_RDX_03;
      }
      tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ptVar6 + (long)unaff_R12;
      tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = ptVar6;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,checkqueue_tests::test_CheckQueueControl_Locks::test_method()::__0>
                ((allocator_type *)
                 tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,(thread *)local_160,__args);
      __args = extraout_RDX_00;
      ptVar15 = tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    ptVar15 = ptVar15 + 1;
    this_01 = this_01 + 1;
    ptVar6 = tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
    ._M_finish = ptVar15;
  } while (this_01 != (condition_variable *)0x3);
  for (; ptVar6 != ptVar15; ptVar6 = ptVar6 + 1) {
    if ((ptVar6->_M_id)._M_thread != 0) {
      std::thread::join();
    }
  }
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x17a;
  file.m_begin = (iterator)&local_e0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f0,msg);
  m.super___mutex_base._M_mutex._8_8_ = m.super___mutex_base._M_mutex._8_8_ & 0xffffffffffffff00;
  m.super___mutex_base._M_mutex.__align = (long)&PTR__lazy_ostream_01388f08;
  m.super___mutex_base._M_mutex._16_8_ = boost::unit_test::lazy_ostream::inst;
  m.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0xf4aea1;
  _done_ack = 0;
  tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)CONCAT71(tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_start._1_7_,
                                fails.super___atomic_base<int>._M_i == 0);
  tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  l._M_device = (mutex_type *)anon_var_dwarf_5f903d;
  l._8_8_ = (long)
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
            + 0x69;
  local_148 = (condition_variable *)&local_190;
  local_190 = &fails;
  local_160._8_8_ = local_160._8_8_ & 0xffffffffffffff00;
  local_160._0_8_ = &PTR__lazy_ostream_0138a410;
  local_150 = (atomic<int> *)boost::unit_test::lazy_ostream::inst;
  unaff_R12 = (atomic<int> *)&has_lock;
  _cv = &PTR__lazy_ostream_013890c8;
  pvVar10 = (iterator)0x2;
  pvVar11 = (iterator)0x2;
  _has_lock = &done_ack;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tg_1,(lazy_ostream *)&m,2,2,REQUIRE,0xe49d2a,(size_t)&l,0x17a,
             local_160,"0",&cv);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&tg);
  tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  m.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  m.super___mutex_base._M_mutex._16_8_ = 0;
  m.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  m.super___mutex_base._M_mutex.__align = 0;
  m.super___mutex_base._M_mutex._8_8_ = 0;
  this_01 = &cv;
  std::condition_variable::condition_variable(this_01);
  _has_lock = (bool *)((ulong)_has_lock & 0xffffffffffffff00);
  nThreads.super___atomic_base<int>._M_i =
       (__atomic_base<int>)((uint)nThreads.super___atomic_base<int>._M_i & 0xffffff00);
  fails.super___atomic_base<int>._M_i =
       (__atomic_base<int>)((uint)fails.super___atomic_base<int>._M_i & 0xffffff00);
  _done_ack = _done_ack & 0xffffff00;
  l._8_8_ = l._8_8_ & 0xffffffffffffff00;
  l._M_device = (mutex_type *)&m;
  std::unique_lock<std::mutex>::lock(&l);
  ptVar4 = tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ptVar9 = tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  l._M_owns = true;
  local_160._0_8_ = &queue;
  local_140 = &nThreads;
  local_138 = &fails;
  local_160._8_8_ = (lazy_ostream *)&m;
  local_150 = unaff_R12;
  local_148 = this_01;
  local_130 = &done_ack;
  if (tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ptVar12 = (pointer)((long)tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    if (ptVar12 == (pointer)0x7ffffffffffffff8) {
LAB_003167ce:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        uVar7 = std::__throw_length_error("vector::_M_realloc_insert");
        __cxa_begin_catch(uVar7);
        if (unaff_R12 == (atomic<int> *)0x0) {
          if ((ptVar12->_M_id)._M_thread != 0) {
            std::terminate();
          }
        }
        else {
          operator_delete(unaff_R12,(long)this_01 << 3);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          uVar7 = __cxa_rethrow();
          __cxa_end_catch();
          std::unique_lock<std::mutex>::~unique_lock(&l);
          std::condition_variable::~condition_variable(&cv);
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&tg_1);
          std::unique_ptr<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>::
          ~unique_ptr(&queue);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            _Unwind_Resume(uVar7);
          }
        }
      }
      goto LAB_0031698d;
    }
    uVar13 = (long)ptVar12 >> 3;
    uVar5 = uVar13 + (uVar13 == 0);
    uVar8 = uVar5 + uVar13;
    if (0xffffffffffffffe < uVar8) {
      uVar8 = 0xfffffffffffffff;
    }
    if (CARRY8(uVar5,uVar13)) {
      uVar8 = 0xfffffffffffffff;
    }
    if (uVar8 == 0) {
      ptVar6 = (thread *)0x0;
      __args_01 = __args_00;
    }
    else {
      ptVar6 = __gnu_cxx::new_allocator<std::thread>::allocate
                         ((new_allocator<std::thread> *)&tg_1,uVar8,(void *)0x0);
      __args_01 = extraout_RDX_04;
    }
    std::allocator_traits<std::allocator<std::thread>>::
    construct<std::thread,checkqueue_tests::test_CheckQueueControl_Locks::test_method()::__1>
              ((allocator_type *)(ptVar6 + uVar13),(thread *)local_160,__args_01);
    ptVar15 = ptVar6;
    for (ptVar12 = ptVar9; ptVar12 != ptVar4; ptVar12 = ptVar12 + 1) {
      (ptVar15->_M_id)._M_thread = (ptVar12->_M_id)._M_thread;
      (ptVar12->_M_id)._M_thread = 0;
      ptVar15 = ptVar15 + 1;
    }
    if (ptVar9 != (pointer)0x0) {
      operator_delete(ptVar9,(long)tg_1.
                                   super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar9)
      ;
    }
    tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ptVar6 + uVar8;
    tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = ptVar6;
  }
  else {
    std::allocator_traits<std::allocator<std::thread>>::
    construct<std::thread,checkqueue_tests::test_CheckQueueControl_Locks::test_method()::__1>
              ((allocator_type *)
               tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish,(thread *)local_160,__args_00);
    ptVar15 = tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_finish = ptVar15 + 1;
  if (has_lock == false) {
    do {
      std::condition_variable::wait((unique_lock *)&cv);
    } while (has_lock == false);
  }
  uVar14 = 0;
  do {
    iVar3 = pthread_mutex_trylock
                      ((pthread_mutex_t *)
                       ((long)queue._M_t.
                              super___uniq_ptr_impl<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_CCheckQueue<FakeCheck>_*,_std::default_delete<CCheckQueue<FakeCheck>_>_>
                              .super__Head_base<0UL,_CCheckQueue<FakeCheck>_*,_false>._M_head_impl +
                       0xd8));
    if (iVar3 == 0) break;
    bVar2 = uVar14 < 99;
    uVar14 = uVar14 + 1;
  } while (bVar2);
  nThreads.super___atomic_base<int>._M_i._0_1_ = 1;
  std::condition_variable::notify_one();
  if ((char)fails.super___atomic_base<int>._M_i == '\0') {
    do {
      std::condition_variable::wait((unique_lock *)&cv);
    } while ((char)fails.super___atomic_base<int>._M_i == '\0');
  }
  _done_ack = CONCAT31(uStack_f3,1);
  std::condition_variable::notify_one();
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar16 = 0x31669c;
  file_00.m_end = (iterator)0x19e;
  file_00.m_begin = (iterator)&local_170;
  msg_00.m_end = pvVar11;
  msg_00.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_180,
             msg_00);
  tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,iVar3 != 0);
  tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_190 = (atomic<int> *)0xe49d29;
  local_188 = "";
  local_160._8_8_ = local_160._8_8_ & 0xffffffffffffff00;
  local_160._0_8_ = &PTR__lazy_ostream_01389048;
  local_150 = (atomic<int> *)boost::unit_test::lazy_ostream::inst;
  local_148 = (condition_variable *)&local_190;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
  ;
  local_198 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tg,(lazy_ostream *)local_160,2,0,WARN,_cVar16,(size_t)&local_1a0,
             0x19e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::unique_lock<std::mutex>::~unique_lock(&l);
  ptVar12 = tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ptVar9 = tg_1.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start; ptVar9 != ptVar12; ptVar9 = ptVar9 + 1) {
    if ((ptVar9->_M_id)._M_thread != 0) {
      std::thread::join();
    }
  }
  std::condition_variable::~condition_variable(&cv);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&tg_1);
  std::unique_ptr<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>::
  ~unique_ptr(&queue);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0031698d:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueueControl_Locks)
{
    auto queue = std::make_unique<Standard_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    {
        std::vector<std::thread> tg;
        std::atomic<int> nThreads {0};
        std::atomic<int> fails {0};
        for (size_t i = 0; i < 3; ++i) {
            tg.emplace_back(
                    [&]{
                    CCheckQueueControl<FakeCheck> control(queue.get());
                    // While sleeping, no other thread should execute to this point
                    auto observed = ++nThreads;
                    UninterruptibleSleep(std::chrono::milliseconds{10});
                    fails += observed  != nThreads;
                    });
        }
        for (auto& thread: tg) {
            if (thread.joinable()) thread.join();
        }
        BOOST_REQUIRE_EQUAL(fails, 0);
    }
    {
        std::vector<std::thread> tg;
        std::mutex m;
        std::condition_variable cv;
        bool has_lock{false};
        bool has_tried{false};
        bool done{false};
        bool done_ack{false};
        {
            std::unique_lock<std::mutex> l(m);
            tg.emplace_back([&]{
                    CCheckQueueControl<FakeCheck> control(queue.get());
                    std::unique_lock<std::mutex> ll(m);
                    has_lock = true;
                    cv.notify_one();
                    cv.wait(ll, [&]{return has_tried;});
                    done = true;
                    cv.notify_one();
                    // Wait until the done is acknowledged
                    //
                    cv.wait(ll, [&]{return done_ack;});
                    });
            // Wait for thread to get the lock
            cv.wait(l, [&](){return has_lock;});
            bool fails = false;
            for (auto x = 0; x < 100 && !fails; ++x) {
                fails = queue->m_control_mutex.try_lock();
            }
            has_tried = true;
            cv.notify_one();
            cv.wait(l, [&](){return done;});
            // Acknowledge the done
            done_ack = true;
            cv.notify_one();
            BOOST_REQUIRE(!fails);
        }
        for (auto& thread: tg) {
            if (thread.joinable()) thread.join();
        }
    }
}